

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void anon_unknown.dwarf_b296a::optimizeWasm(Module *wasm,PassOptions *options)

{
  WalkerPass<wasm::PostWalker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_>_> local_300;
  PassOptions local_1c0;
  PassRunner local_108 [8];
  PassRunner runner;
  PassOptions *options_local;
  Module *wasm_local;
  
  ::wasm::PassOptions::PassOptions(&local_1c0,options);
  ::wasm::PassRunner::PassRunner(local_108,wasm,&local_1c0);
  ::wasm::PassOptions::~PassOptions(&local_1c0);
  memset(&local_300,0,0x130);
  optimizeWasm::OptimizeForJS::OptimizeForJS((OptimizeForJS *)&local_300);
  ::wasm::WalkerPass<wasm::PostWalker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_>_>::run
            (&local_300,local_108,wasm);
  optimizeWasm::OptimizeForJS::~OptimizeForJS((OptimizeForJS *)&local_300);
  ::wasm::PassRunner::~PassRunner(local_108);
  return;
}

Assistant:

static void optimizeWasm(Module& wasm, PassOptions options) {
  // Perform various optimizations that will be good for JS, but would not be
  // great for wasm in general
  struct OptimizeForJS : public WalkerPass<PostWalker<OptimizeForJS>> {
    bool isFunctionParallel() override { return true; }

    std::unique_ptr<Pass> create() override {
      return std::make_unique<OptimizeForJS>();
    }

    void visitBinary(Binary* curr) {
      // x - -c (where c is a constant) is larger than x + c, in js (but not
      // necessarily in wasm, where LEBs prefer negatives).
      if (curr->op == SubInt32) {
        if (auto* c = curr->right->dynCast<Const>()) {
          if (c->value.geti32() < 0) {
            curr->op = AddInt32;
            c->value = c->value.neg();
          }
        }
      }
    }
  };

  PassRunner runner(&wasm, options);
  OptimizeForJS().run(&runner, &wasm);
}